

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void __thiscall VmInstruction::AddArgument(VmInstruction *this,VmValue *argument)

{
  VmValue *local_18;
  
  local_18 = argument;
  if (argument == (VmValue *)0x0) {
    __assert_fail("argument",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7b8,"void VmInstruction::AddArgument(VmValue *)");
  }
  if ((argument->type).size != 0 || (argument->type).type != VM_TYPE_VOID) {
    SmallArray<VmValue_*,_4U>::push_back(&this->arguments,&local_18);
    VmValue::AddUse(local_18,&this->super_VmValue);
    return;
  }
  __assert_fail("argument->type != VmType::Void",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x7b9,"void VmInstruction::AddArgument(VmValue *)");
}

Assistant:

void VmInstruction::AddArgument(VmValue *argument)
{
	assert(argument);
	assert(argument->type != VmType::Void);

	arguments.push_back(argument);

	argument->AddUse(this);
}